

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O3

void VP8LRefsCursorNextBlock(VP8LRefsCursor *c)

{
  PixOrCopyBlock *pPVar1;
  PixOrCopy *pPVar2;
  PixOrCopy *pPVar3;
  
  pPVar1 = c->cur_block_->next_;
  if (pPVar1 == (PixOrCopyBlock *)0x0) {
    pPVar2 = (PixOrCopy *)0x0;
    pPVar3 = (PixOrCopy *)0x0;
  }
  else {
    pPVar2 = pPVar1->start_;
    pPVar3 = pPVar2 + pPVar1->size_;
  }
  c->cur_pos = pPVar2;
  c->last_pos_ = pPVar3;
  c->cur_block_ = pPVar1;
  return;
}

Assistant:

void VP8LRefsCursorNextBlock(VP8LRefsCursor* const c) {
  PixOrCopyBlock* const b = c->cur_block_->next_;
  c->cur_pos = (b == NULL) ? NULL : b->start_;
  c->last_pos_ = (b == NULL) ? NULL : b->start_ + b->size_;
  c->cur_block_ = b;
}